

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

void __thiscall
soplex::DSVectorBase<double>::DSVectorBase<double>
          (DSVectorBase<double> *this,SVectorBase<double> *old)

{
  DSVectorBase<double> *in_RSI;
  undefined8 *in_RDI;
  
  SVectorBase<double>::SVectorBase
            ((SVectorBase<double> *)in_RSI,(int)((ulong)in_RDI >> 0x20),(Nonzero<double> *)0x27f946)
  ;
  *in_RDI = &PTR__DSVectorBase_00896e28;
  in_RDI[3] = 0;
  SVectorBase<double>::size((SVectorBase<double> *)in_RSI);
  allocMem(in_RSI,(int)((ulong)in_RDI >> 0x20));
  SVectorBase<double>::operator=((SVectorBase<double> *)this,old);
  return;
}

Assistant:

explicit DSVectorBase(const SVectorBase<S>& old)
      : theelem(nullptr)
   {
      allocMem(old.size());
      SVectorBase<R>::operator=(old);

      assert(isConsistent());
   }